

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleParallelNoClockAnalyzerSettings.cpp
# Opt level: O2

void __thiscall
SimpleParallelAnalyzerSettings::SimpleParallelAnalyzerSettings(SimpleParallelAnalyzerSettings *this)

{
  auto_ptr<AnalyzerSettingInterfaceNumberList> *this_00;
  auto_ptr<AnalyzerSettingInterfaceChannel> *paVar1;
  AnalyzerSettingInterfaceChannel *pAVar2;
  AnalyzerSettingInterfaceNumberList *this_01;
  ulong uVar3;
  value_type *__x;
  Channel *pCVar4;
  uint uVar5;
  U32 i;
  long lVar6;
  AnalyzerSettingInterfaceChannel *data_channel_interface;
  auto_ptr<AnalyzerSettingInterfaceChannel> *local_98;
  vector<Channel,_std::allocator<Channel>_> *local_90;
  Channel *local_88;
  vector<AnalyzerSettingInterfaceChannel_*,_std::allocator<AnalyzerSettingInterfaceChannel_*>_>
  *local_80;
  char text [64];
  
  AnalyzerSettings::AnalyzerSettings(&this->super_AnalyzerSettings);
  *(undefined ***)this = &PTR__SimpleParallelAnalyzerSettings_0010bd08;
  local_90 = &this->mDataChannels;
  (this->mDataChannels).super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mDataChannels).super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mDataChannels).super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88 = &this->mClockChannel;
  __x = (value_type *)0xffffffffffffffff;
  Channel::Channel(local_88,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  this->mClockEdge = PosEdge;
  local_80 = &this->mDataChannelsInterface;
  local_98 = &this->mClockChannelInterface;
  this_00 = &this->mClockEdgeInterface;
  (this->mDataChannelsInterface).
  super__Vector_base<AnalyzerSettingInterfaceChannel_*,_std::allocator<AnalyzerSettingInterfaceChannel_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mDataChannelsInterface).
  super__Vector_base<AnalyzerSettingInterfaceChannel_*,_std::allocator<AnalyzerSettingInterfaceChannel_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mDataChannelsInterface).
  super__Vector_base<AnalyzerSettingInterfaceChannel_*,_std::allocator<AnalyzerSettingInterfaceChannel_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mClockChannelInterface)._M_ptr = (AnalyzerSettingInterfaceChannel *)0x0;
  (this->mClockEdgeInterface)._M_ptr = (AnalyzerSettingInterfaceNumberList *)0x0;
  uVar3 = 0;
  for (lVar6 = 0; lVar6 != 0x100; lVar6 = lVar6 + 0x10) {
    Channel::Channel((Channel *)text,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
    pCVar4 = (Channel *)text;
    std::vector<Channel,_std::allocator<Channel>_>::emplace_back<Channel>(local_90,(Channel *)text);
    Channel::~Channel((Channel *)text);
    pAVar2 = (AnalyzerSettingInterfaceChannel *)
             AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pCVar4);
    AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(pAVar2);
    data_channel_interface = pAVar2;
    sprintf(text,"D%d",uVar3);
    AnalyzerSettingInterface::SetTitleAndTooltip((char *)data_channel_interface,text);
    AnalyzerSettingInterfaceChannel::SetChannel((Channel *)data_channel_interface);
    AnalyzerSettingInterfaceChannel::SetSelectionOfNoneIsAllowed(SUB81(data_channel_interface,0));
    __x = &data_channel_interface;
    std::
    vector<AnalyzerSettingInterfaceChannel_*,_std::allocator<AnalyzerSettingInterfaceChannel_*>_>::
    push_back(local_80,__x);
    uVar3 = (ulong)((int)uVar3 + 1);
  }
  pAVar2 = (AnalyzerSettingInterfaceChannel *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)__x);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(pAVar2);
  paVar1 = local_98;
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::reset(local_98,pAVar2);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)paVar1->_M_ptr,"Text above");
  pCVar4 = local_88;
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)local_98->_M_ptr);
  this_01 = (AnalyzerSettingInterfaceNumberList *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pCVar4);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(this_01);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::reset(this_00,this_01);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_00->_M_ptr,"");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (0.0,(char *)this_00->_M_ptr,"Data is valid on Clock rising edge");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (1.0,(char *)this_00->_M_ptr,"Data is valid on Clock falling edge");
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mClockEdge);
  for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
    AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  }
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  uVar5 = (uint)this;
  AnalyzerSettings::AddExportOption(uVar5,(char *)0x0);
  AnalyzerSettings::AddExportExtension(uVar5,(char *)0x0,"text");
  AnalyzerSettings::AddExportExtension(uVar5,(char *)0x0,"csv");
  AnalyzerSettings::ClearChannels();
  uVar3 = 0;
  for (lVar6 = 0; lVar6 != 0x100; lVar6 = lVar6 + 0x10) {
    sprintf(text,"D%d",uVar3);
    AnalyzerSettings::AddChannel
              ((Channel *)this,
               (char *)((this->mDataChannels).super__Vector_base<Channel,_std::allocator<Channel>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar6),SUB81(text,0));
    uVar3 = (ulong)((int)uVar3 + 1);
  }
  return;
}

Assistant:

SimpleParallelAnalyzerSettings::SimpleParallelAnalyzerSettings()
:
	mClockChannel( UNDEFINED_CHANNEL ),
	mClockEdge( AnalyzerEnums::PosEdge )
{
	U32 count = 16;
	for( U32 i=0; i<count; i++ )
	{
		mDataChannels.push_back( UNDEFINED_CHANNEL );
		AnalyzerSettingInterfaceChannel* data_channel_interface = new AnalyzerSettingInterfaceChannel();
		
		char text[64];
		sprintf( text, "D%d", i );

		data_channel_interface->SetTitleAndTooltip( text, text );
		data_channel_interface->SetChannel( mDataChannels[i] );
		data_channel_interface->SetSelectionOfNoneIsAllowed( true );

		mDataChannelsInterface.push_back( data_channel_interface );
	}

	//The remainder of the old clock channel stuff provides a means to select
	//where the output goes in the waveform window. There is no clock anymore.
	mClockChannelInterface.reset( new AnalyzerSettingInterfaceChannel() );
	mClockChannelInterface->SetTitleAndTooltip( "Text above", "Analyzer displays output above this channel" );
	mClockChannelInterface->SetChannel( mClockChannel );

	mClockEdgeInterface.reset( new AnalyzerSettingInterfaceNumberList() );
	mClockEdgeInterface->SetTitleAndTooltip( "", "" );
	mClockEdgeInterface->AddNumber( AnalyzerEnums::PosEdge, "Data is valid on Clock rising edge", "Data is valid on Clock rising edge" );
	mClockEdgeInterface->AddNumber( AnalyzerEnums::NegEdge, "Data is valid on Clock falling edge", "Data is valid on Clock falling edge" );
	mClockEdgeInterface->SetNumber( mClockEdge );



	for( U32 i=0; i<count; i++ )
	{
		AddInterface( mDataChannelsInterface[i] );
	}

	AddInterface( mClockChannelInterface.get() );
	//AddInterface( mClockEdgeInterface.get() ); removes clock edge from the settings page

	AddExportOption( 0, "Export as text/csv file" );
	AddExportExtension( 0, "text", "txt" );
	AddExportExtension( 0, "csv", "csv" );

	ClearChannels();
	for( U32 i=0; i<count; i++ )
	{
		char text[64];
		sprintf( text, "D%d", i );
		AddChannel( mDataChannels[i], text, false );
	}
}